

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3DeleteByRowid(Fts3Table *p,sqlite3_value *pRowid,int *pnChng,u32 *aSzDel)

{
  Fts3Table *in_RCX;
  Fts3Table *in_RDX;
  int *in_RSI;
  long in_RDI;
  int *unaff_retaddr;
  u32 *in_stack_00000008;
  int isEmpty;
  int bFound;
  int rc;
  int in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  int iVar1;
  uint uVar2;
  int iVar3;
  
  iVar3 = 0;
  uVar2 = 0;
  fts3DeleteTerms(pnChng,(Fts3Table *)aSzDel,_bFound,in_stack_00000008,unaff_retaddr);
  if ((uVar2 != 0) && (iVar3 == 0)) {
    iVar1 = 0;
    iVar3 = fts3IsEmpty(in_RCX,(sqlite3_value *)(ulong)uVar2,(int *)(ulong)in_stack_ffffffffffffffd0
                       );
    if (iVar3 == 0) {
      if (iVar1 == 0) {
        *(int *)&(in_RDX->base).pModule = *(int *)&(in_RDX->base).pModule + -1;
        if (*(long *)(in_RDI + 0x50) == 0) {
          fts3SqlExec(in_RSI,in_RDX,(int)((ulong)in_RCX >> 0x20),(sqlite3_value **)(ulong)uVar2);
        }
        if (*(char *)(in_RDI + 0x1be) != '\0') {
          fts3SqlExec(in_RSI,in_RDX,(int)((ulong)in_RCX >> 0x20),
                      (sqlite3_value **)CONCAT44(iVar3,uVar2));
        }
      }
      else {
        iVar3 = fts3DeleteAll((Fts3Table *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                              in_stack_ffffffffffffffcc);
        *(undefined4 *)&(in_RDX->base).pModule = 0;
        memset(in_RCX,0,(long)(*(int *)(in_RDI + 0x30) + 1) << 3);
      }
    }
  }
  return iVar3;
}

Assistant:

static int fts3DeleteByRowid(
  Fts3Table *p, 
  sqlite3_value *pRowid, 
  int *pnChng,                    /* IN/OUT: Decrement if row is deleted */
  u32 *aSzDel
){
  int rc = SQLITE_OK;             /* Return code */
  int bFound = 0;                 /* True if *pRowid really is in the table */

  fts3DeleteTerms(&rc, p, pRowid, aSzDel, &bFound);
  if( bFound && rc==SQLITE_OK ){
    int isEmpty = 0;              /* Deleting *pRowid leaves the table empty */
    rc = fts3IsEmpty(p, pRowid, &isEmpty);
    if( rc==SQLITE_OK ){
      if( isEmpty ){
        /* Deleting this row means the whole table is empty. In this case
        ** delete the contents of all three tables and throw away any
        ** data in the pendingTerms hash table.  */
        rc = fts3DeleteAll(p, 1);
        *pnChng = 0;
        memset(aSzDel, 0, sizeof(u32) * (p->nColumn+1) * 2);
      }else{
        *pnChng = *pnChng - 1;
        if( p->zContentTbl==0 ){
          fts3SqlExec(&rc, p, SQL_DELETE_CONTENT, &pRowid);
        }
        if( p->bHasDocsize ){
          fts3SqlExec(&rc, p, SQL_DELETE_DOCSIZE, &pRowid);
        }
      }
    }
  }

  return rc;
}